

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv6address.cpp
# Opt level: O1

bool __thiscall jrtplib::RTPIPv6Address::IsFromSameHost(RTPIPv6Address *this,RTPAddress *addr)

{
  ulong uVar1;
  
  if ((addr != (RTPAddress *)0x0) && (addr->addresstype == IPv6Address)) {
    uVar1 = 0xffffffffffffffff;
    while ((&(this->super_RTPAddress).field_0xd)[uVar1] == (&addr->field_0xd)[uVar1]) {
      uVar1 = uVar1 + 1;
      if (uVar1 == 0xf) {
        return 0xe < uVar1;
      }
    }
  }
  return false;
}

Assistant:

bool RTPIPv6Address::IsFromSameHost(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != RTPAddress::IPv6Address)
		return false;

	const RTPIPv6Address *addr2 = (const RTPIPv6Address *)addr;
	const uint8_t *ip2 = addr2->ip.s6_addr;
	for (int i = 0 ; i < 16 ; i++)
	{
		if (ip.s6_addr[i] != ip2[i])
			return false;
	}
	return true;
}